

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O1

int Lpk_NodeCutsCheckDsd(Lpk_Man_t *p,Lpk_Cut_t *pCut)

{
  uint *puVar1;
  int *__s;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  
  if ((*(uint *)pCut & 0x3f) == 0) {
    __assert_fail("pCut->nLeaves > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                  ,0x117,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
  }
  __s = p->pRefs;
  uVar13 = 0;
  memset(__s,0,(ulong)((*(uint *)pCut & 0x3f) << 2));
  if ((undefined1  [820])((undefined1  [820])*pCut & (undefined1  [820])0x3f) !=
      (undefined1  [820])0x0) {
    uVar12 = 0;
    do {
      iVar11 = pCut->pLeaves[uVar12];
      if (((long)iVar11 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= iVar11))
      goto LAB_004e4823;
      pvVar5 = pVVar4->pArray[iVar11];
      if ((*(uint *)((long)pvVar5 + 0x14) & 0x10) != 0) {
        __assert_fail("pObj->fMarkA == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                      ,0x11d,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
      }
      *(uint *)((long)pvVar5 + 0x14) = *(uint *)((long)pvVar5 + 0x14) | 0x10;
      *(ulong *)((long)pvVar5 + 0x40) = uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (*(uint *)pCut & 0x3f));
  }
  if ((undefined1  [820])((undefined1  [820])*pCut & (undefined1  [820])0xfc0) !=
      (undefined1  [820])0x0) {
    pVVar4 = p->pNtk->vObjs;
    uVar12 = 0;
    uVar13 = 0;
    do {
      iVar11 = pCut->pNodes[uVar12];
      if (((long)iVar11 < 0) || (pVVar4->nSize <= iVar11)) goto LAB_004e4823;
      plVar6 = (long *)pVVar4->pArray[iVar11];
      if (*(int *)((long)plVar6 + 0x1c) < 1) {
LAB_004e4732:
        lVar14 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        p->pCands[lVar14] = (int)plVar6[2];
      }
      else {
        lVar14 = plVar6[4];
        lVar7 = *(long *)(*(long *)(*plVar6 + 0x20) + 8);
        lVar16 = 0;
        bVar10 = true;
        do {
          lVar8 = *(long *)(lVar7 + (long)*(int *)(lVar14 + lVar16 * 4) * 8);
          bVar9 = false;
          if ((*(byte *)(lVar8 + 0x14) & 0x10) != 0) {
            __s[*(int *)(lVar8 + 0x40)] = __s[*(int *)(lVar8 + 0x40)] + 1;
            bVar9 = bVar10;
          }
          lVar16 = lVar16 + 1;
          bVar10 = bVar9;
        } while (lVar16 < *(int *)((long)plVar6 + 0x1c));
        if (bVar9) goto LAB_004e4732;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (*(uint *)pCut >> 6 & 0x3f));
  }
  if (0 < (int)uVar13) {
    pVVar4 = p->pNtk->vObjs;
    uVar12 = 0;
    do {
      iVar11 = p->pCands[uVar12];
      if (((long)iVar11 < 0) || (pVVar4->nSize <= iVar11)) goto LAB_004e4823;
      plVar6 = (long *)pVVar4->pArray[iVar11];
      uVar2 = *(uint *)((long)plVar6 + 0x1c);
      if ((int)uVar2 < 1) {
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        do {
          lVar14 = *(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                            (long)*(int *)(plVar6[4] + uVar15 * 4) * 8);
          if ((*(byte *)(lVar14 + 0x14) & 0x10) == 0) {
            __assert_fail("pFanin->fMarkA == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                          ,0x135,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
          }
          if (1 < __s[*(int *)(lVar14 + 0x40)]) goto LAB_004e47cc;
          uVar15 = uVar15 + 1;
        } while (uVar2 != uVar15);
        uVar15 = (ulong)uVar2;
      }
LAB_004e47cc:
      if ((uint)uVar15 == uVar2) {
        iVar11 = 1;
        goto LAB_004e47e1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar13);
  }
  iVar11 = 0;
LAB_004e47e1:
  if ((undefined1  [820])((undefined1  [820])*pCut & (undefined1  [820])0x3f) !=
      (undefined1  [820])0x0) {
    uVar12 = 0;
    do {
      iVar3 = pCut->pLeaves[uVar12];
      if (((long)iVar3 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= iVar3)) {
LAB_004e4823:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)((long)pVVar4->pArray[iVar3] + 0x14);
      *puVar1 = *puVar1 & 0xffffffef;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (*(uint *)pCut & 0x3f));
  }
  return iVar11;
}

Assistant:

int Lpk_NodeCutsCheckDsd( Lpk_Man_t * p, Lpk_Cut_t * pCut )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nCands, fLeavesOnly, RetValue;
    assert( pCut->nLeaves > 0 );
    // clear ref counters
    memset( p->pRefs, 0, sizeof(int) * pCut->nLeaves );
    // mark cut leaves
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
    {
        assert( pObj->fMarkA == 0 );
        pObj->fMarkA = 1;
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;
    }
    // ref leaves pointed from the internal nodes
    nCands = 0;
    Lpk_CutForEachNode( p->pNtk, pCut, pObj, i )
    {
        fLeavesOnly = 1;
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pFanin->fMarkA )
                p->pRefs[(int)(ABC_PTRUINT_T)pFanin->pCopy]++;
            else
                fLeavesOnly = 0;
        if ( fLeavesOnly )
            p->pCands[nCands++] = pObj->Id;
    }
    // look at the nodes that only point to the leaves
    RetValue = 0;
    for ( i = 0; i < nCands; i++ )
    {
        pObj = Abc_NtkObj( p->pNtk, p->pCands[i] );
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            assert( pFanin->fMarkA == 1 );
            if ( p->pRefs[(int)(ABC_PTRUINT_T)pFanin->pCopy] > 1 )
                break;
        }
        if ( k == Abc_ObjFaninNum(pObj) )
        {
            RetValue = 1;
            break;
        }
    }
    // unmark cut leaves
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
        pObj->fMarkA = 0;
    return RetValue;
}